

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

void __thiscall
RegisterCLParserTestDuplicatedHeaderPathConverted::RegisterCLParserTestDuplicatedHeaderPathConverted
          (RegisterCLParserTestDuplicatedHeaderPathConverted *this)

{
  RegisterCLParserTestDuplicatedHeaderPathConverted *this_local;
  
  RegisterTest(CLParserTestDuplicatedHeaderPathConverted::Create,
               "CLParserTest.DuplicatedHeaderPathConverted");
  return;
}

Assistant:

TEST(CLParserTest, DuplicatedHeaderPathConverted) {
  CLParser parser;
  string output, err;

  // This isn't inline in the Parse() call below because the #ifdef in
  // a macro expansion would confuse MSVC2013's preprocessor.
  const char kInput[] =
      "Note: including file: sub/./foo.h\r\n"
      "Note: including file: bar.h\r\n"
#ifdef _WIN32
      "Note: including file: sub\\foo.h\r\n";
#else
      "Note: including file: sub/foo.h\r\n";
#endif
  ASSERT_TRUE(parser.Parse(kInput, "", &output, &err));
  // We should have dropped one copy of foo.h.
  ASSERT_EQ("", output);
  ASSERT_EQ(2u, parser.includes_.size());
}